

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

QPDFPageObjectHelper * __thiscall
QPDFPageObjectHelper::shallowCopyPage
          (QPDFPageObjectHelper *__return_storage_ptr__,QPDFPageObjectHelper *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> oh;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  QPDFObjectHandle new_page;
  allocator<char> local_51;
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  QPDF *qpdf;
  QPDFPageObjectHelper *this_local;
  
  qpdf = (QPDF *)this;
  this_local = __return_storage_ptr__;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffffd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"QPDFPageObjectHelper::shallowCopyPage called with a direct object"
             ,&local_51);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&stack0xffffffffffffffd0,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd0);
  local_20._M_pi = p_Var1;
  QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xffffffffffffff78);
  QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)&stack0xffffffffffffff88);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff78);
  oh._M_pi = local_20._M_pi;
  QPDFObjectHandle::QPDFObjectHandle(&local_a8,(QPDFObjectHandle *)&stack0xffffffffffffff88);
  QPDF::makeIndirectObject((QPDF *)&local_98,(QPDFObjectHandle *)oh._M_pi);
  QPDFPageObjectHelper(__return_storage_ptr__,&local_98);
  QPDFObjectHandle::~QPDFObjectHandle(&local_98);
  QPDFObjectHandle::~QPDFObjectHandle(&local_a8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff88);
  return __return_storage_ptr__;
}

Assistant:

QPDFPageObjectHelper
QPDFPageObjectHelper::shallowCopyPage()
{
    QPDF& qpdf = oh().getQPDF("QPDFPageObjectHelper::shallowCopyPage called with a direct object");
    QPDFObjectHandle new_page = oh().shallowCopy();
    return {qpdf.makeIndirectObject(new_page)};
}